

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

void __thiscall mkvmuxer::Track::~Track(Track *this)

{
  void *pvVar1;
  undefined8 *in_RDI;
  ContentEncoding *encoding;
  uint32_t i;
  ContentEncoding *in_stack_ffffffffffffffb0;
  uint local_c;
  
  *in_RDI = &PTR__Track_01fca558;
  if ((void *)in_RDI[1] != (void *)0x0) {
    operator_delete__((void *)in_RDI[1]);
  }
  if ((void *)in_RDI[2] != (void *)0x0) {
    operator_delete__((void *)in_RDI[2]);
  }
  if ((void *)in_RDI[3] != (void *)0x0) {
    operator_delete__((void *)in_RDI[3]);
  }
  if ((void *)in_RDI[5] != (void *)0x0) {
    operator_delete__((void *)in_RDI[5]);
  }
  if (in_RDI[0xd] != 0) {
    for (local_c = 0; local_c < *(uint *)(in_RDI + 0xe); local_c = local_c + 1) {
      pvVar1 = *(void **)(in_RDI[0xd] + (ulong)local_c * 8);
      if (pvVar1 != (void *)0x0) {
        ContentEncoding::~ContentEncoding(in_stack_ffffffffffffffb0);
        operator_delete(pvVar1);
      }
    }
    if ((void *)in_RDI[0xd] != (void *)0x0) {
      operator_delete__((void *)in_RDI[0xd]);
    }
  }
  return;
}

Assistant:

Track::~Track() {
  delete[] codec_id_;
  delete[] codec_private_;
  delete[] language_;
  delete[] name_;

  if (content_encoding_entries_) {
    for (uint32_t i = 0; i < content_encoding_entries_size_; ++i) {
      ContentEncoding* const encoding = content_encoding_entries_[i];
      delete encoding;
    }
    delete[] content_encoding_entries_;
  }
}